

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool endSession(qpTestLog *log)

{
  qpTestLog *log_local;
  
  qpXmlWriter_flush(log->writer);
  fprintf((FILE *)log->outputFile,"\n#endSession\n");
  qpTestLog_flushFile(log);
  log->isSessionOpen = 0;
  return 1;
}

Assistant:

static deBool endSession (qpTestLog* log)
{
	DE_ASSERT(log && log->isSessionOpen);

    /* Make sure xml is flushed. */
    qpXmlWriter_flush(log->writer);

    /* Write out #endSession. */
	fprintf(log->outputFile, "\n#endSession\n");
	qpTestLog_flushFile(log);

	log->isSessionOpen = DE_FALSE;

	return DE_TRUE;
}